

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O1

void __thiscall
soul::BlockBuilder::addAssignment(BlockBuilder *this,Expression *dest,Expression *source)

{
  AssignFromValue *pAVar1;
  CodeLocation local_18;
  
  local_18.sourceCode.object = (SourceCodeText *)0x0;
  local_18.location.data = (char *)0x0;
  pAVar1 = PoolAllocator::
           allocate<soul::heart::AssignFromValue,soul::CodeLocation,soul::heart::Expression&,soul::heart::Expression&>
                     (&this->module->allocator->pool,&local_18,dest,source);
  (*this->_vptr_BlockBuilder[2])(this,pAVar1);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_18.sourceCode.object);
  return;
}

Assistant:

void addAssignment (heart::Expression& dest, heart::Expression& source)
    {
        createStatement<heart::AssignFromValue> (CodeLocation(), dest, source);
    }